

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

int encodeutf8(uchar *dstbuf,int dstlen,uchar *srcbuf,int srclen,int *carry)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  int iVar4;
  byte bVar5;
  byte *pbVar6;
  int iVar7;
  uint uVar8;
  byte *pbVar9;
  
  iVar7 = (int)dstbuf;
  iVar4 = (int)srcbuf;
  if (0 < dstlen && 0 < srclen) {
    pbVar6 = dstbuf + dstlen;
    pbVar3 = srcbuf + srclen;
    do {
      uVar8 = cube2unichars[*srcbuf];
      if ((int)uVar8 < 0x80) {
        bVar2 = true;
        if (dstbuf < pbVar6) {
          pbVar1 = dstbuf;
          pbVar9 = srcbuf + ((long)pbVar6 - (long)dstbuf);
          if (pbVar3 < srcbuf + ((long)pbVar6 - (long)dstbuf)) {
            pbVar9 = pbVar3;
          }
          do {
            srcbuf = srcbuf + 1;
            dstbuf = pbVar1 + 1;
            *pbVar1 = (byte)uVar8;
            if (pbVar9 <= srcbuf) {
              bVar2 = true;
              goto LAB_00159007;
            }
            uVar8 = cube2unichars[*srcbuf];
            pbVar1 = dstbuf;
          } while ((int)uVar8 < 0x80);
          bVar2 = false;
LAB_00159007:
          if (srcbuf < pbVar9) goto LAB_00159010;
        }
      }
      else {
LAB_00159010:
        if ((int)uVar8 < 0x800) {
          bVar2 = true;
          if (pbVar6 < dstbuf + 2) goto LAB_00159121;
          bVar5 = (byte)(uVar8 >> 6) | 0xc0;
        }
        else {
          if ((int)uVar8 < 0x10000) {
            bVar2 = true;
            if (pbVar6 < dstbuf + 3) goto LAB_00159121;
            *dstbuf = (byte)(uVar8 >> 0xc) | 0xe0;
            dstbuf = dstbuf + 1;
          }
          else {
            if (0x1fffff < (int)uVar8) {
              bVar5 = (byte)(uVar8 >> 0x18);
              if ((int)uVar8 < 0x4000000) {
                bVar2 = true;
                if (dstbuf + 5 <= pbVar6) {
                  *dstbuf = bVar5 | 0xf8;
                  dstbuf = dstbuf + 1;
LAB_001590e0:
                  bVar5 = (byte)(uVar8 >> 0x12) & 0x3f | 0x80;
                  goto LAB_001590ec;
                }
              }
              else {
                bVar2 = true;
                if (dstbuf + 6 <= pbVar6) {
                  *dstbuf = bVar5 >> 6 | 0xfc;
                  dstbuf[1] = bVar5 & 0x3f | 0x80;
                  dstbuf = dstbuf + 2;
                  goto LAB_001590e0;
                }
              }
              goto LAB_00159121;
            }
            bVar2 = true;
            if (pbVar6 < dstbuf + 4) goto LAB_00159121;
            bVar5 = (byte)(uVar8 >> 0x12) | 0xf0;
LAB_001590ec:
            *dstbuf = bVar5;
            dstbuf[1] = (byte)(uVar8 >> 0xc) & 0x3f | 0x80;
            dstbuf = dstbuf + 2;
          }
          bVar5 = (byte)(uVar8 >> 6) & 0x3f | 0x80;
        }
        *dstbuf = bVar5;
        dstbuf[1] = (byte)uVar8 & 0x3f | 0x80;
        dstbuf = dstbuf + 2;
        bVar2 = false;
      }
LAB_00159121:
    } while ((!bVar2) && (srcbuf = srcbuf + 1, srcbuf < pbVar3));
  }
  if (carry != (int *)0x0) {
    *carry = *carry + ((int)srcbuf - iVar4);
  }
  return (int)dstbuf - iVar7;
}

Assistant:

int encodeutf8(uchar *dstbuf, int dstlen, const uchar *srcbuf, int srclen, int *carry)
{
    uchar *dst = dstbuf, *dstend = &dstbuf[dstlen];
    const uchar *src = srcbuf, *srcend = &srcbuf[srclen];
    if(src < srcend && dst < dstend) do
    {
        int uni = cube2uni(*src);
        if(uni <= 0x7F)
        {
            if(dst >= dstend) goto done;
            const uchar *end = min(srcend, &src[dstend-dst]);
            do
            {
                *dst++ = uni;
                if(++src >= end) goto done;
                uni = cube2uni(*src);
            }
            while(uni <= 0x7F);
        }
        if(uni <= 0x7FF) { if(dst + 2 > dstend) goto done; *dst++ = 0xC0 | (uni>>6); goto uni2; }
        else if(uni <= 0xFFFF) { if(dst + 3 > dstend) goto done; *dst++ = 0xE0 | (uni>>12); goto uni3; }
        else if(uni <= 0x1FFFFF) { if(dst + 4 > dstend) goto done; *dst++ = 0xF0 | (uni>>18); goto uni4; }
        else if(uni <= 0x3FFFFFF) { if(dst + 5 > dstend) goto done; *dst++ = 0xF8 | (uni>>24); goto uni5; }
        else if(uni <= 0x7FFFFFFF) { if(dst + 6 > dstend) goto done; *dst++ = 0xFC | (uni>>30); goto uni6; }
        else goto uni1;
    uni6: *dst++ = 0x80 | ((uni>>24)&0x3F);
    uni5: *dst++ = 0x80 | ((uni>>18)&0x3F);
    uni4: *dst++ = 0x80 | ((uni>>12)&0x3F);
    uni3: *dst++ = 0x80 | ((uni>>6)&0x3F);
    uni2: *dst++ = 0x80 | (uni&0x3F);
    uni1:;
    }
    while(++src < srcend);

done:
    if(carry) *carry += src - srcbuf;
    return dst - dstbuf;
}